

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# licm_pass.cpp
# Opt level: O3

bool __thiscall
spvtools::opt::LICMPass::IsImmediatelyContainedInLoop
          (LICMPass *this,Loop *loop,Function *f,BasicBlock *bb)

{
  Instruction *this_00;
  LoopDescriptor *pLVar1;
  const_iterator cVar2;
  Loop *pLVar3;
  uint32_t local_1c;
  
  pLVar1 = IRContext::GetLoopDescriptor((this->super_Pass).context_,f);
  this_00 = (bb->label_)._M_t.
            super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
            ._M_t.
            super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
            .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
  local_1c = 0;
  if (this_00->has_result_id_ == true) {
    local_1c = Instruction::GetSingleWordOperand(this_00,(uint)this_00->has_type_id_);
  }
  cVar2 = std::
          _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::Loop_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Loop_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&(pLVar1->basic_block_to_loop_)._M_h,&local_1c);
  if (cVar2.super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::Loop_*>,_false>.
      _M_cur == (__node_type *)0x0) {
    pLVar3 = (Loop *)0x0;
  }
  else {
    pLVar3 = *(Loop **)((long)cVar2.
                              super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::Loop_*>,_false>
                              ._M_cur + 0x10);
  }
  return pLVar3 == loop;
}

Assistant:

bool LICMPass::IsImmediatelyContainedInLoop(Loop* loop, Function* f,
                                            BasicBlock* bb) {
  LoopDescriptor* loop_descriptor = context()->GetLoopDescriptor(f);
  return loop == (*loop_descriptor)[bb->id()];
}